

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O3

void * r2i_certpol(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *value)

{
  char *pcVar1;
  OPENSSL_STACK *sk;
  long *plVar2;
  bool bVar3;
  int iVar4;
  OPENSSL_STACK *sk_00;
  OPENSSL_STACK *sk_01;
  size_t sVar5;
  undefined8 *puVar6;
  OPENSSL_STACK *sk_02;
  ASN1_VALUE *val;
  size_t sVar7;
  OPENSSL_STACK *pOVar8;
  ASN1_VALUE *pAVar9;
  size_t sVar10;
  ASN1_OBJECT *pAVar11;
  ASN1_IA5STRING *str;
  size_t sVar12;
  ASN1_VALUE *pAVar13;
  ASN1_VALUE *pAVar14;
  OPENSSL_STACK *sk_03;
  size_t sVar15;
  void *pvVar16;
  ASN1_INTEGER *a;
  size_t sVar17;
  ASN1_STRING *str_00;
  int iVar18;
  
  sk_00 = OPENSSL_sk_new_null();
  if (sk_00 != (OPENSSL_STACK *)0x0) {
    sk_01 = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk_01 != (OPENSSL_STACK *)0x0) {
      sVar5 = OPENSSL_sk_num(sk_01);
      if (sVar5 == 0) {
LAB_002184cf:
        OPENSSL_sk_pop_free_ex(sk_01,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
        return sk_00;
      }
      bVar3 = false;
      sVar5 = 0;
LAB_00217fbe:
      puVar6 = (undefined8 *)OPENSSL_sk_value(sk_01,sVar5);
      if ((puVar6[2] == 0) && (pcVar1 = (char *)puVar6[1], pcVar1 != (char *)0x0)) {
        iVar4 = strcmp(pcVar1,"ia5org");
        if (iVar4 == 0) {
          bVar3 = true;
LAB_002184bb:
          sVar5 = sVar5 + 1;
          sVar7 = OPENSSL_sk_num(sk_01);
          if (sVar7 <= sVar5) goto LAB_002184cf;
          goto LAB_00217fbe;
        }
        if (*pcVar1 != '@') {
          pAVar11 = OBJ_txt2obj(pcVar1,0);
          if (pAVar11 == (ASN1_OBJECT *)0x0) {
            iVar4 = 0x81;
            iVar18 = 0x9b;
            goto LAB_00218536;
          }
          val = ASN1_item_new((ASN1_ITEM *)&POLICYINFO_it);
          if (val == (ASN1_VALUE *)0x0) {
            ASN1_OBJECT_free(pAVar11);
          }
          else {
            *(ASN1_OBJECT **)val = pAVar11;
LAB_002184a7:
            sVar7 = OPENSSL_sk_push(sk_00,val);
            if (sVar7 != 0) goto LAB_002184bb;
            ASN1_item_free(val,(ASN1_ITEM *)&POLICYINFO_it);
          }
          goto LAB_002187f7;
        }
        sk_02 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,pcVar1 + 1);
        if (sk_02 != (OPENSSL_STACK *)0x0) {
          val = ASN1_item_new((ASN1_ITEM *)&POLICYINFO_it);
          if (val != (ASN1_VALUE *)0x0) {
            sVar7 = OPENSSL_sk_num(sk_02);
            if (sVar7 != 0) {
              sVar7 = 0;
              do {
                puVar6 = (undefined8 *)OPENSSL_sk_value(sk_02,sVar7);
                pcVar1 = (char *)puVar6[1];
                iVar4 = strcmp(pcVar1,"policyIdentifier");
                if (iVar4 == 0) {
                  pAVar11 = OBJ_txt2obj((char *)puVar6[2],0);
                  if (pAVar11 == (ASN1_OBJECT *)0x0) {
                    iVar4 = 0x81;
                    iVar18 = 0xc2;
                    goto LAB_00218707;
                  }
                  *(ASN1_OBJECT **)val = pAVar11;
                }
                else {
                  iVar4 = x509v3_conf_name_matches(pcVar1,"CPS");
                  if (iVar4 == 0) {
                    iVar4 = x509v3_conf_name_matches((char *)puVar6[1],"userNotice");
                    if (iVar4 == 0) {
                      iVar4 = 0x82;
                      iVar18 = 0xf6;
                    }
                    else if (*(char *)puVar6[2] == '@') {
                      pOVar8 = (OPENSSL_STACK *)
                               X509V3_get_section((X509V3_CTX *)ctx,(char *)puVar6[2] + 1);
                      if (pOVar8 != (OPENSSL_STACK *)0x0) {
                        pAVar9 = ASN1_item_new((ASN1_ITEM *)&POLICYQUALINFO_it);
                        if (pAVar9 != (ASN1_VALUE *)0x0) {
                          pAVar11 = OBJ_nid2obj(0xa5);
                          *(ASN1_OBJECT **)pAVar9 = pAVar11;
                          if (pAVar11 == (ASN1_OBJECT *)0x0) {
                            iVar4 = 0x44;
                            iVar18 = 0x112;
                          }
                          else {
                            pAVar13 = ASN1_item_new((ASN1_ITEM *)&USERNOTICE_it);
                            if (pAVar13 == (ASN1_VALUE *)0x0) goto LAB_0021869d;
                            *(ASN1_VALUE **)(pAVar9 + 8) = pAVar13;
                            sVar10 = OPENSSL_sk_num(pOVar8);
                            if (sVar10 != 0) {
                              sVar10 = 0;
                              do {
                                puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar8,sVar10);
                                pcVar1 = (char *)puVar6[1];
                                iVar4 = strcmp(pcVar1,"explicitText");
                                if (iVar4 == 0) {
                                  str_00 = ASN1_VISIBLESTRING_new();
                                  *(ASN1_STRING **)(pAVar13 + 8) = str_00;
                                  if (str_00 == (ASN1_VISIBLESTRING *)0x0) goto LAB_0021869d;
LAB_002183bb:
                                  pcVar1 = (char *)puVar6[2];
                                  sVar12 = strlen(pcVar1);
                                  iVar4 = ASN1_STRING_set(str_00,pcVar1,(int)sVar12);
                                  if (iVar4 == 0) goto LAB_0021869d;
                                }
                                else {
                                  iVar4 = strcmp(pcVar1,"organization");
                                  if (iVar4 == 0) {
                                    pAVar14 = *(ASN1_VALUE **)pAVar13;
                                    if (pAVar14 == (ASN1_VALUE *)0x0) {
                                      pAVar14 = ASN1_item_new((ASN1_ITEM *)&NOTICEREF_it);
                                      if (pAVar14 == (ASN1_VALUE *)0x0) goto LAB_0021869d;
                                      *(ASN1_VALUE **)pAVar13 = pAVar14;
                                    }
                                    str_00 = *(ASN1_STRING **)pAVar14;
                                    str_00->type = (uint)!bVar3 * 4 + 0x16;
                                    goto LAB_002183bb;
                                  }
                                  iVar4 = strcmp(pcVar1,"noticeNumbers");
                                  if (iVar4 != 0) {
                                    ERR_put_error(0x14,0,0x82,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x14e);
                                    ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],
                                                       ",value:",puVar6[2]);
                                    goto LAB_0021869d;
                                  }
                                  pAVar14 = *(ASN1_VALUE **)pAVar13;
                                  if (pAVar14 == (ASN1_VALUE *)0x0) {
                                    pAVar14 = ASN1_item_new((ASN1_ITEM *)&NOTICEREF_it);
                                    if (pAVar14 == (ASN1_VALUE *)0x0) goto LAB_0021869d;
                                    *(ASN1_VALUE **)pAVar13 = pAVar14;
                                  }
                                  sk_03 = (OPENSSL_STACK *)X509V3_parse_list((char *)puVar6[2]);
                                  if ((sk_03 == (OPENSSL_STACK *)0x0) ||
                                     (sVar15 = OPENSSL_sk_num(sk_03), sVar15 == 0)) {
                                    ERR_put_error(0x14,0,0x80,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x143);
                                    ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],
                                                       ",value:",puVar6[2]);
LAB_00218687:
                                    OPENSSL_sk_pop_free_ex
                                              (sk_03,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
                                    goto LAB_0021869d;
                                  }
                                  sk = *(OPENSSL_STACK **)(pAVar14 + 8);
                                  sVar15 = OPENSSL_sk_num(sk_03);
                                  if (sVar15 != 0) {
                                    sVar15 = 0;
                                    do {
                                      pvVar16 = OPENSSL_sk_value(sk_03,sVar15);
                                      a = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,
                                                           *(char **)((long)pvVar16 + 8));
                                      if (a == (ASN1_INTEGER *)0x0) {
                                        ERR_put_error(0x14,0,0x7f,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                  ,0x167);
                                        goto LAB_00218687;
                                      }
                                      sVar17 = OPENSSL_sk_push(sk,a);
                                      if (sVar17 == 0) {
                                        ASN1_INTEGER_free(a);
                                        goto LAB_00218687;
                                      }
                                      sVar15 = sVar15 + 1;
                                      sVar17 = OPENSSL_sk_num(sk_03);
                                    } while (sVar15 < sVar17);
                                  }
                                  OPENSSL_sk_pop_free_ex
                                            (sk_03,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
                                }
                                sVar10 = sVar10 + 1;
                                sVar15 = OPENSSL_sk_num(pOVar8);
                              } while (sVar10 < sVar15);
                            }
                            plVar2 = *(long **)pAVar13;
                            if ((plVar2 == (long *)0x0) || ((plVar2[1] != 0 && (*plVar2 != 0)))) {
                              pOVar8 = *(OPENSSL_STACK **)(val + 8);
                              if (pOVar8 == (OPENSSL_STACK *)0x0) {
                                pOVar8 = OPENSSL_sk_new_null();
                                *(OPENSSL_STACK **)(val + 8) = pOVar8;
                              }
                              sVar10 = OPENSSL_sk_push(pOVar8,pAVar9);
                              if (sVar10 != 0) goto LAB_00218164;
                              goto LAB_002187d0;
                            }
                            iVar4 = 0x8a;
                            iVar18 = 0x156;
                          }
                          ERR_put_error(0x14,0,iVar4,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                        ,iVar18);
                        }
LAB_0021869d:
                        ASN1_item_free(pAVar9,(ASN1_ITEM *)&POLICYQUALINFO_it);
                        goto LAB_002187d0;
                      }
                      iVar4 = 0x86;
                      iVar18 = 0xe7;
                    }
                    else {
                      iVar4 = 0x6f;
                      iVar18 = 0xe0;
                    }
LAB_00218707:
                    ERR_put_error(0x14,0,iVar4,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                  ,iVar18);
                    ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:",puVar6[2]);
                    goto LAB_002187d0;
                  }
                  if (*(long *)(val + 8) == 0) {
                    pOVar8 = OPENSSL_sk_new_null();
                    *(OPENSSL_STACK **)(val + 8) = pOVar8;
                  }
                  pAVar9 = ASN1_item_new((ASN1_ITEM *)&POLICYQUALINFO_it);
                  if ((pAVar9 == (ASN1_VALUE *)0x0) ||
                     (sVar10 = OPENSSL_sk_push(*(OPENSSL_STACK **)(val + 8),pAVar9), sVar10 == 0))
                  goto LAB_002187d0;
                  pAVar11 = OBJ_nid2obj(0xa4);
                  *(ASN1_OBJECT **)pAVar9 = pAVar11;
                  if (pAVar11 == (ASN1_OBJECT *)0x0) {
                    iVar4 = 0x44;
                    iVar18 = 0xd4;
                    goto LAB_002187cb;
                  }
                  str = ASN1_IA5STRING_new();
                  *(ASN1_IA5STRING **)(pAVar9 + 8) = str;
                  if (str == (ASN1_IA5STRING *)0x0) goto LAB_002187d0;
                  pcVar1 = (char *)puVar6[2];
                  sVar12 = strlen(pcVar1);
                  iVar4 = ASN1_STRING_set(str,pcVar1,(int)sVar12);
                  if (iVar4 == 0) goto LAB_002187d0;
                }
LAB_00218164:
                sVar7 = sVar7 + 1;
                sVar10 = OPENSSL_sk_num(sk_02);
              } while (sVar7 < sVar10);
            }
            if (*(long *)val != 0) goto LAB_002184a7;
            iVar4 = 0x8e;
            iVar18 = 0xfd;
LAB_002187cb:
            ERR_put_error(0x14,0,iVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,iVar18);
          }
LAB_002187d0:
          ASN1_item_free(val,(ASN1_ITEM *)&POLICYINFO_it);
          goto LAB_002187f7;
        }
        iVar4 = 0x86;
        iVar18 = 0x8f;
      }
      else {
        iVar4 = 0x83;
        iVar18 = 0x83;
      }
LAB_00218536:
      ERR_put_error(0x14,0,iVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                    ,iVar18);
      ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:",puVar6[2]);
      goto LAB_002187f7;
    }
    ERR_put_error(0x14,0,0x14,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                  ,0x7c);
    sk_01 = (OPENSSL_STACK *)0x0;
LAB_002187f7:
    OPENSSL_sk_pop_free_ex(sk_01,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
    OPENSSL_sk_pop_free_ex(sk_00,sk_POLICYINFO_call_free_func,POLICYINFO_free);
  }
  return (void *)0x0;
}

Assistant:

static void *r2i_certpol(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *value) {
  STACK_OF(POLICYINFO) *pols = sk_POLICYINFO_new_null();
  if (pols == NULL) {
    return NULL;
  }
  STACK_OF(CONF_VALUE) *vals = X509V3_parse_list(value);

  {
    if (vals == NULL) {
      OPENSSL_PUT_ERROR(X509V3, ERR_R_X509V3_LIB);
      goto err;
    }
    int ia5org = 0;
    for (size_t i = 0; i < sk_CONF_VALUE_num(vals); i++) {
      const CONF_VALUE *cnf = sk_CONF_VALUE_value(vals, i);
      if (cnf->value || !cnf->name) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_POLICY_IDENTIFIER);
        X509V3_conf_err(cnf);
        goto err;
      }
      POLICYINFO *pol;
      const char *pstr = cnf->name;
      if (!strcmp(pstr, "ia5org")) {
        ia5org = 1;
        continue;
      } else if (*pstr == '@') {
        const STACK_OF(CONF_VALUE) *polsect = X509V3_get_section(ctx, pstr + 1);
        if (!polsect) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SECTION);

          X509V3_conf_err(cnf);
          goto err;
        }
        pol = policy_section(ctx, polsect, ia5org);
        if (!pol) {
          goto err;
        }
      } else {
        ASN1_OBJECT *pobj = OBJ_txt2obj(cnf->name, 0);
        if (pobj == NULL) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
          X509V3_conf_err(cnf);
          goto err;
        }
        pol = POLICYINFO_new();
        if (pol == NULL) {
          ASN1_OBJECT_free(pobj);
          goto err;
        }
        pol->policyid = pobj;
      }
      if (!sk_POLICYINFO_push(pols, pol)) {
        POLICYINFO_free(pol);
        goto err;
      }
    }
    sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
    return pols;
  }

err:
  sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
  sk_POLICYINFO_pop_free(pols, POLICYINFO_free);
  return NULL;
}